

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(CURLM *m,fd_set *read_fd_set,fd_set *write_fd_set,fd_set *exc_fd_set,
                          int *max_fd)

{
  undefined1 local_80 [8];
  easy_pollset ps;
  Curl_easy *data;
  uint i;
  Curl_multi *multi;
  Curl_llist_node *e;
  int *piStack_38;
  int this_max_fd;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  CURLM *m_local;
  
  e._4_4_ = -1;
  if ((m == (CURLM *)0x0) || (*m != 0xbab1e)) {
    m_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((*(byte *)((long)m + 0x2d1) >> 2 & 1) == 0) {
    piStack_38 = max_fd;
    max_fd_local = (int *)exc_fd_set;
    exc_fd_set_local = write_fd_set;
    write_fd_set_local = read_fd_set;
    read_fd_set_local = (fd_set *)m;
    for (multi = (Curl_multi *)Curl_llist_head((Curl_llist *)((long)m + 0x30));
        multi != (Curl_multi *)0x0; multi = (Curl_multi *)Curl_node_next((Curl_llist_node *)multi))
    {
      ps._24_8_ = Curl_node_elem((Curl_llist_node *)multi);
      Curl_multi_getsock((Curl_easy *)ps._24_8_,(easy_pollset *)local_80,"curl_multi_fdset");
      for (data._4_4_ = 0; data._4_4_ < (uint)ps.sockets[3]; data._4_4_ = data._4_4_ + 1) {
        if (*(int *)(local_80 + (ulong)data._4_4_ * 4) < 0x400) {
          if ((*(byte *)((long)ps.sockets + (ulong)data._4_4_ + 0x10) & 1) != 0) {
            write_fd_set_local->fds_bits[*(int *)(local_80 + (ulong)data._4_4_ * 4) / 0x40] =
                 1L << ((byte)((long)*(int *)(local_80 + (ulong)data._4_4_ * 4) % 0x40) & 0x3f) |
                 write_fd_set_local->fds_bits[*(int *)(local_80 + (ulong)data._4_4_ * 4) / 0x40];
          }
          if ((*(byte *)((long)ps.sockets + (ulong)data._4_4_ + 0x10) & 2) != 0) {
            exc_fd_set_local->fds_bits[*(int *)(local_80 + (ulong)data._4_4_ * 4) / 0x40] =
                 1L << ((byte)((long)*(int *)(local_80 + (ulong)data._4_4_ * 4) % 0x40) & 0x3f) |
                 exc_fd_set_local->fds_bits[*(int *)(local_80 + (ulong)data._4_4_ * 4) / 0x40];
          }
          if (e._4_4_ < *(int *)(local_80 + (ulong)data._4_4_ * 4)) {
            e._4_4_ = *(int *)(local_80 + (ulong)data._4_4_ * 4);
          }
        }
      }
    }
    Curl_cshutdn_setfds((cshutdn *)((long)m + 0x1e8),*(Curl_easy **)((long)m + 0x98),
                        write_fd_set_local,exc_fd_set_local,(int *)((long)&e + 4));
    *piStack_38 = e._4_4_;
    m_local._4_4_ = CURLM_OK;
  }
  else {
    m_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return m_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *m,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  struct Curl_multi *multi = m;
  unsigned int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    struct easy_pollset ps;

    Curl_multi_getsock(data, &ps, "curl_multi_fdset");

    for(i = 0; i < ps.num; i++) {
      if(!FDSET_SOCK(ps.sockets[i]))
        /* pretend it does not exist */
        continue;
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
      if(ps.actions[i] & CURL_POLL_IN)
        FD_SET(ps.sockets[i], read_fd_set);
      if(ps.actions[i] & CURL_POLL_OUT)
        FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
      if((int)ps.sockets[i] > this_max_fd)
        this_max_fd = (int)ps.sockets[i];
    }
  }

  Curl_cshutdn_setfds(&multi->cshutdn, multi->admin,
                      read_fd_set, write_fd_set, &this_max_fd);

  *max_fd = this_max_fd;

  return CURLM_OK;
}